

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall duckdb::ClientContext::Destroy(ClientContext *this)

{
  type lock_00;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_> uStack_18;
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&uStack_18,&this->context_lock);
  if ((this->transaction).current_transaction.
      super_unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>._M_t.
      super___uniq_ptr_impl<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MetaTransaction_*,_std::default_delete<duckdb::MetaTransaction>_>
      .super__Head_base<0UL,_duckdb::MetaTransaction_*,_false>._M_head_impl !=
      (MetaTransaction *)0x0) {
    TransactionContext::ResetActiveQuery(&this->transaction);
    if ((this->transaction).auto_commit == false) {
      TransactionContext::Rollback(&this->transaction,(optional_ptr<duckdb::ErrorData,_true>)0x0);
    }
  }
  lock_00 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
            ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                         *)&uStack_18);
  CleanupInternal(this,lock_00,(BaseQueryResult *)0x0,false);
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&uStack_18);
  return;
}

Assistant:

void ClientContext::Destroy() {
	auto lock = LockContext();
	if (transaction.HasActiveTransaction()) {
		transaction.ResetActiveQuery();
		if (!transaction.IsAutoCommit()) {
			transaction.Rollback(nullptr);
		}
	}
	CleanupInternal(*lock);
}